

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O2

void cos1D_testSaveLoadAndParamHandling<IMLE<1,1,FastLinearExpert>>
               (IMLE<1,_1,_FastLinearExpert> *imleObj)

{
  ostream *poVar1;
  allocator local_c1;
  string local_c0;
  Param param;
  
  IMLE<1,_1,_FastLinearExpert>::Param::Param(&param,&imleObj->param);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t-- Initial parameters: --");
  std::endl<char,std::char_traits<char>>(poVar1);
  IMLE<1,_1,_FastLinearExpert>::Param::display(&imleObj->param,(ostream *)&std::cout);
  std::__cxx11::string::string((string *)&local_c0,"cos1D.xml",&local_c1);
  IMLE<1,_1,_FastLinearExpert>::loadParameters(imleObj,&local_c0);
  std::__cxx11::string::_M_dispose();
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "\t-- Now the IMLE object has default parameters: --");
  std::endl<char,std::char_traits<char>>(poVar1);
  IMLE<1,_1,_FastLinearExpert>::Param::display(&imleObj->param,(ostream *)&std::cout);
  IMLE<1,_1,_FastLinearExpert>::setParameters(imleObj,&param);
  poVar1 = std::operator<<((ostream *)&std::cout,"\t-- Reverting to initial parameters: --");
  std::endl<char,std::char_traits<char>>(poVar1);
  IMLE<1,_1,_FastLinearExpert>::Param::display(&imleObj->param,(ostream *)&std::cout);
  cos1D_train<IMLE<1,1,FastLinearExpert>>(imleObj,10);
  cos1D_display<IMLE<1,1,FastLinearExpert>>(imleObj);
  std::__cxx11::string::string((string *)&local_c0,"cos1D_demo.imle",&local_c1);
  IMLE<1,_1,_FastLinearExpert>::save(imleObj,&local_c0);
  std::__cxx11::string::_M_dispose();
  IMLE<1,_1,_FastLinearExpert>::reset(imleObj);
  operator<<((ostream *)&std::cout,imleObj);
  cos1D_train<IMLE<1,1,FastLinearExpert>>(imleObj,0x14);
  cos1D_display<IMLE<1,1,FastLinearExpert>>(imleObj);
  std::__cxx11::string::string((string *)&local_c0,"cos1D_demo.imle",&local_c1);
  IMLE<1,_1,_FastLinearExpert>::load(imleObj,&local_c0);
  std::__cxx11::string::_M_dispose();
  operator<<((ostream *)&std::cout,imleObj);
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void cos1D_testSaveLoadAndParamHandling( Learner &imleObj )
{
	// Parameter handling
	typename Learner::Param param = imleObj.getParameters();
	cout << "\t-- Initial parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.loadParameters("cos1D.xml");
	cout << "\t-- Now the IMLE object has default parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.setParameters(param);
	cout << "\t-- Reverting to initial parameters: --" << endl;
	imleObj.displayParameters();

	// Training (10 points)
    cos1D_train(imleObj, 10);

    // Display info
    cos1D_display(imleObj);

    // Save
    imleObj.save("cos1D_demo.imle");

    // Reset
    imleObj.reset();
    cout << imleObj;

    // Train again
    cos1D_train(imleObj, 20);
    cos1D_display(imleObj);

    // Load
    imleObj.load("cos1D_demo.imle");
    cout << imleObj;
}